

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sourceCode.c
# Opt level: O3

void sysbvm_sourceCode_computeLineAndColumnForIndex
               (sysbvm_context_t *context,sysbvm_tuple_t sourceCode,sysbvm_tuple_t index,
               uint32_t *outLine,uint32_t *outColumn)

{
  sysbvm_tuple_t orderedCollection;
  ulong uVar1;
  ulong uVar2;
  sysbvm_tuple_t element;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint32_t uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar1 = *(ulong *)(sourceCode + 0x40);
  if (uVar1 == 0) {
    orderedCollection = sysbvm_orderedCollection_create(context);
    uVar1 = *(ulong *)(sourceCode + 0x10);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      sysbvm_orderedCollection_add(context,orderedCollection,9);
    }
    else {
      uVar10 = *(uint *)(uVar1 + 0xc);
      sysbvm_orderedCollection_add(context,orderedCollection,9);
      if ((ulong)uVar10 != 0) {
        element = 0x19;
        uVar3 = 0;
        do {
          if (*(char *)(uVar1 + 0x10 + uVar3) == '\n') {
            sysbvm_orderedCollection_add(context,orderedCollection,element);
          }
          uVar3 = uVar3 + 1;
          element = element + 0x10;
        } while (uVar10 != uVar3);
      }
    }
    uVar1 = sysbvm_orderedCollection_asArray(context,orderedCollection);
    *(ulong *)(sourceCode + 0x40) = uVar1;
  }
  bVar12 = (uVar1 & 0xf) != 0;
  if (bVar12 || uVar1 == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  if (index == 0 || (index & 0xf) != 0) {
    uVar10 = (uint)(index >> 4);
  }
  else {
    uVar10 = *(uint *)(index + 0x10);
  }
  if (uVar3 == 0) {
    uVar6 = 1;
    iVar4 = 0;
  }
  else {
    uVar11 = 0;
    uVar7 = 0;
    uVar5 = 0;
    do {
      uVar8 = (uVar3 - uVar11 >> 1) + uVar11;
      if (bVar12 || uVar1 == 0) {
        uVar9 = 0;
LAB_001365a9:
        uVar9 = uVar9 >> 4;
      }
      else {
        uVar9 = *(ulong *)(uVar1 + 0x10 + uVar8 * 8);
        if (uVar9 == 0 || (uVar9 & 0xf) != 0) goto LAB_001365a9;
        uVar9 = (ulong)*(uint *)(uVar9 + 0x10);
      }
      uVar2 = uVar8;
      if ((uint)uVar9 <= uVar10) {
        uVar11 = uVar8 + 1;
        uVar5 = uVar9 & 0xffffffff;
        uVar2 = uVar3;
        uVar7 = uVar8;
      }
      iVar4 = (int)uVar5;
      uVar3 = uVar2;
    } while (uVar11 < uVar2);
    uVar6 = (int)uVar7 + 1;
  }
  if (outLine != (uint32_t *)0x0) {
    *outLine = uVar6;
  }
  if (outColumn != (uint32_t *)0x0) {
    *outColumn = (uVar10 - iVar4) + 1;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_sourceCode_computeLineAndColumnForIndex(sysbvm_context_t *context, sysbvm_tuple_t sourceCode, sysbvm_tuple_t index, uint32_t *outLine, uint32_t *outColumn)
{
    // Make sure the line start index table is built.
    sysbvm_tuple_t indexTable = sysbvm_sourceCode_ensureLineStartIndexTableIsBuilt(context, sourceCode);

    // Perform a binary search.
    size_t indexTableSize = sysbvm_array_getSize(indexTable);
    size_t indexValue = sysbvm_tuple_uint32_decode(index);

    size_t left = 0;
    size_t right = indexTableSize;
    size_t bestSoFar = 0;
    size_t bestIndexSoFar = 0;
    while(left < right)
    {
        size_t middle = left + (right - left) / 2;
        size_t middleIndex = sysbvm_tuple_uint32_decode(sysbvm_array_at(indexTable, middle));
        if(middleIndex <= indexValue)
        {
            bestSoFar = middle;
            bestIndexSoFar = middleIndex;
            left = middle + 1;
        }
        else if(middleIndex > indexValue)
        {
            right = middle;
        }
    }

    size_t line = bestSoFar + 1;
    size_t column = indexValue - bestIndexSoFar + 1;

    // Emit the result.
    if(outLine)
        *outLine = line;
    if(outColumn)
        *outColumn = column;
}